

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::IdentityShaderCase::getFragmentSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  string *psVar1;
  string *extraout_RAX;
  string source;
  ContextType local_3c;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "${VERSION_DECL}\nin mediump vec4 v_fragment_color;\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = v_fragment_color;\n}\n"
             ,"");
  local_3c.super_ApiType.m_bits =
       (ApiType)(**(code **)(**(long **)(*(long *)((long)this + 0x70) + 8) + 0x10))();
  psVar1 = anon_unknown_1::specializeShader(__return_storage_ptr__,&local_38,&local_3c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    psVar1 = extraout_RAX;
  }
  return psVar1;
}

Assistant:

std::string IdentityShaderCase::getFragmentSource (void) const
{
	std::string source =	"${VERSION_DECL}\n"
							"in mediump vec4 v_fragment_color;\n"
							"layout(location = 0) out mediump vec4 fragColor;\n"
							"void main (void)\n"
							"{\n"
							"	fragColor = v_fragment_color;\n"
							"}\n";

return specializeShader(source, m_context.getRenderContext().getType());
}